

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateExtkeyFromSeedRequest,cfd::js::api::json::CreateExtkeyResponse,cfd::js::api::CreateExtkeyFromSeedRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromSeedRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_550;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_498 [4];
  JsonClassBase<cfd::js::api::json::CreateExtkeyResponse> local_478 [4];
  undefined1 local_458 [8];
  CreateExtkeyResponse res_2;
  undefined1 local_3f8 [8];
  CreateExtkeyResponseStruct response;
  CreateExtkeyFromSeedRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_b8 [8];
  CreateExtkeyFromSeedRequest req;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromSeedRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._144_8_ = call_function;
  CreateExtkeyFromSeedRequest::CreateExtkeyFromSeedRequest((CreateExtkeyFromSeedRequest *)local_b8);
  core::JsonClassBase<cfd::js::api::json::CreateExtkeyFromSeedRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateExtkeyFromSeedRequest> *)local_b8,
             request_message);
  CreateExtkeyFromSeedRequest::ConvertToStruct
            ((CreateExtkeyFromSeedRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateExtkeyFromSeedRequest *)local_b8);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromSeedRequestStruct_&)>
  ::operator()((CreateExtkeyResponseStruct *)local_3f8,call_function,
               (CreateExtkeyFromSeedRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    CreateExtkeyResponse::CreateExtkeyResponse((CreateExtkeyResponse *)local_458);
    CreateExtkeyResponse::ConvertFromStruct
              ((CreateExtkeyResponse *)local_458,(CreateExtkeyResponseStruct *)local_3f8);
    core::JsonClassBase<cfd::js::api::json::CreateExtkeyResponse>::Serialize_abi_cxx11_(local_478);
    std::__cxx11::string::operator=((string *)this,(string *)local_478);
    std::__cxx11::string::~string((string *)local_478);
    CreateExtkeyResponse::~CreateExtkeyResponse((CreateExtkeyResponse *)local_458);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_550,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_498);
    std::__cxx11::string::operator=((string *)this,(string *)local_498);
    std::__cxx11::string::~string((string *)local_498);
    ErrorResponse::~ErrorResponse(&local_550);
  }
  res_2._87_1_ = 1;
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct((CreateExtkeyResponseStruct *)local_3f8);
  CreateExtkeyFromSeedRequestStruct::~CreateExtkeyFromSeedRequestStruct
            ((CreateExtkeyFromSeedRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateExtkeyFromSeedRequest::~CreateExtkeyFromSeedRequest((CreateExtkeyFromSeedRequest *)local_b8)
  ;
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}